

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void __thiscall AActor::PostSerialize(AActor *this)

{
  AActor **ppAVar1;
  AActor *pAVar2;
  player_t *ppVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar7;
  double dVar8;
  undefined8 *puVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined8 *puVar11;
  
  this->touching_sectorlist = (msecnode_t *)0x0;
  this->touching_rendersectors = (msecnode_t *)0x0;
  LinkToWorld(this,(FLinkContext *)0x0,false,this->Sector);
  if (this->tid == 0) {
    this->inext = (AActor *)0x0;
    this->iprev = (AActor **)0x0;
  }
  else {
    ppAVar1 = TIDHash + (this->tid & 0x7f);
    pAVar2 = *ppAVar1;
    this->inext = pAVar2;
    this->iprev = ppAVar1;
    *ppAVar1 = this;
    if (pAVar2 != (AActor *)0x0) {
      pAVar2->iprev = &this->inext;
    }
  }
  ppVar3 = this->player;
  if (ppVar3 != (player_t *)0x0) {
    if (((playeringame[((long)&ppVar3[-0x91ab].ConversationNPCAngle >> 5) * -0x30c30c30c30c30c3] ==
          true) && (ppVar3->cls != (PClassPlayerPawn *)0x0)) && (((this->flags4).Value & 0x20) == 0)
       ) {
      if (this->state->sprite ==
          *(int *)(*(long *)((ppVar3->cls->super_PClassActor).super_PClass.Defaults + 0x448) + 0x10)
         ) {
        puVar9 = (undefined8 *)
                 ((long)&((ppVar3->userinfo).
                          super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                         .Nodes)->Next +
                 (ulong)(((ppVar3->userinfo).
                          super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                          .Size - 1 & 0x208) * 0x18));
        do {
          puVar11 = puVar9;
          puVar9 = (undefined8 *)*puVar11;
        } while (*(int *)(puVar11 + 1) != 0x208);
        this->sprite = skins[*(int *)(puVar11[2] + 0x28)].sprite;
      }
    }
    if ((this->Speed == 0.0) && (!NAN(this->Speed))) {
      if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar10 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
        (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar10);
      }
      this->Speed = *(double *)(((this->super_DThinker).super_DObject.Class)->Defaults + 0xe0);
    }
  }
  dVar7 = (this->__Pos).X;
  dVar8 = (this->__Pos).Y;
  (this->Prev).Z = (this->__Pos).Z;
  (this->Prev).X = dVar7;
  (this->Prev).Y = dVar8;
  (this->PrevAngles).Roll.Degrees = (this->Angles).Roll.Degrees;
  uVar4 = *(undefined4 *)((long)&(this->Angles).Pitch.Degrees + 4);
  uVar5 = *(undefined4 *)&(this->Angles).Yaw.Degrees;
  uVar6 = *(undefined4 *)((long)&(this->Angles).Yaw.Degrees + 4);
  *(undefined4 *)&(this->PrevAngles).Pitch.Degrees = *(undefined4 *)&(this->Angles).Pitch.Degrees;
  *(undefined4 *)((long)&(this->PrevAngles).Pitch.Degrees + 4) = uVar4;
  *(undefined4 *)&(this->PrevAngles).Yaw.Degrees = uVar5;
  *(undefined4 *)((long)&(this->PrevAngles).Yaw.Degrees + 4) = uVar6;
  if (this->Sector == (sector_t *)0x0) {
    iVar10 = 0;
  }
  else {
    iVar10 = this->Sector->PortalGroup;
  }
  this->PrevPortalGroup = iVar10;
  (*(this->super_DThinker).super_DObject._vptr_DObject[0x19])(this,0);
  return;
}

Assistant:

void AActor::PostSerialize()
{
	touching_sectorlist = nullptr;
	touching_rendersectors = nullptr;
	LinkToWorld(nullptr, false, Sector);

	AddToHash();
	if (player)
	{
		if (playeringame[player - players] &&
			player->cls != NULL &&
			!(flags4 & MF4_NOSKIN) &&
			state->sprite == GetDefaultByType(player->cls)->SpawnState->sprite)
		{ // Give player back the skin
			sprite = skins[player->userinfo.GetSkin()].sprite;
		}
		if (Speed == 0)
		{
			Speed = GetDefault()->Speed;
		}
	}
	ClearInterpolation();
	UpdateWaterLevel(false);
}